

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.h
# Opt level: O3

uint __thiscall Js::ByteCodeWriter::DataChunk::RemainingBytes(DataChunk *this)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  byte *pbVar6;
  byte *pbVar7;
  
  uVar1 = this->byteSize;
  pbVar6 = this->currentByte;
  pbVar7 = this->buffer;
  if (pbVar6 < pbVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeWriter.h"
                                ,0x2f,"(currentByte >= buffer)","currentByte >= buffer");
    if (!bVar4) goto LAB_0089b552;
    *puVar5 = 0;
    pbVar6 = this->currentByte;
    pbVar7 = this->buffer;
  }
  if (uVar1 < (uint)((int)pbVar6 - (int)pbVar7)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeWriter.h"
                                ,0x2a,"(byteSize >= GetCurrentOffset())",
                                "byteSize >= GetCurrentOffset()");
    if (!bVar4) goto LAB_0089b552;
    *puVar5 = 0;
    pbVar6 = this->currentByte;
    pbVar7 = this->buffer;
  }
  uVar2 = this->byteSize;
  if (pbVar6 < pbVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeWriter.h"
                                ,0x2f,"(currentByte >= buffer)","currentByte >= buffer");
    if (!bVar4) {
LAB_0089b552:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
    pbVar6 = this->currentByte;
    pbVar7 = this->buffer;
  }
  return uVar2 + ((int)pbVar7 - (int)pbVar6);
}

Assistant:

inline uint RemainingBytes()
            {
                Assert(byteSize >= GetCurrentOffset());
                return byteSize - GetCurrentOffset();
            }